

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpDisassemble::BeginFunctionBody
          (BinaryReaderObjdumpDisassemble *this,Index index,Offset size)

{
  bool bVar1;
  Offset OVar2;
  size_type sVar3;
  const_pointer pvVar4;
  mapped_type *pmVar5;
  undefined1 local_38 [8];
  string_view name;
  Offset size_local;
  BinaryReaderObjdumpDisassemble *pBStack_18;
  Index index_local;
  BinaryReaderObjdumpDisassemble *this_local;
  
  name._M_str = (char *)size;
  size_local._4_4_ = index;
  pBStack_18 = this;
  OVar2 = anon_unknown_15::BinaryReaderObjdumpBase::GetPrintOffset
                    (&this->super_BinaryReaderObjdumpBase,
                     ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.
                      super_BinaryReaderDelegate.state)->offset);
  printf("%06zx func[%u]",OVar2,(ulong)size_local._4_4_);
  _local_38 = anon_unknown_15::BinaryReaderObjdumpBase::GetFunctionName
                        (&this->super_BinaryReaderObjdumpBase,size_local._4_4_);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
  if (!bVar1) {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
    printf(" <%.*s>",sVar3 & 0xffffffff,pvVar4);
  }
  printf(":\n");
  this->last_opcode_end = 0;
  this->in_function_body = true;
  this->current_function_index = size_local._4_4_;
  pmVar5 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&((this->super_BinaryReaderObjdumpBase).objdump_state_)->
                         function_param_counts,(key_type *)((long)&size_local + 4));
  this->local_index_ = *pmVar5;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::BeginFunctionBody(Index index,
                                                         Offset size) {
  printf("%06" PRIzx " func[%" PRIindex "]", GetPrintOffset(state->offset),
         index);
  auto name = GetFunctionName(index);
  if (!name.empty()) {
    printf(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  printf(":\n");

  last_opcode_end = 0;
  in_function_body = true;
  current_function_index = index;
  local_index_ = objdump_state_->function_param_counts[index];
  return Result::Ok;
}